

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v7::basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
          (basic_string_view<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  char *pcVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  basic_string_view<char> *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::data();
  this->data_ = pcVar1;
  sVar2 = std::__cxx11::string::size();
  this->size_ = sVar2;
  return;
}

Assistant:

FMT_CONSTEXPR basic_string_view(
      const std::basic_string<Char, Traits, Alloc>& s) FMT_NOEXCEPT
      : data_(s.data()),
        size_(s.size()) {}

  template <typename S, FMT_ENABLE_IF(std::is_same<
                                      S, detail::std_string_view<Char>>::value)>
  FMT_CONSTEXPR basic_string_view(S s) FMT_NOEXCEPT : data_(s.data()),
                                                      size_(s.size()) {}

  /** Returns a pointer to the string data. */
  constexpr const Char* data() const { return data_; }